

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Csv.cpp
# Opt level: O0

int __thiscall CASC_CSV::GetBinary(CASC_CSV *this,LPBYTE pbBuffer,size_t nMaxBytes,size_t Index)

{
  size_t Index_local;
  size_t nMaxBytes_local;
  LPBYTE pbBuffer_local;
  CASC_CSV *this_local;
  
  if (Index < this->nColumns) {
    if (this->Columns[Index].nLength == nMaxBytes * 2) {
      this_local._4_4_ =
           ConvertStringToBinary(this->Columns[Index].szString,nMaxBytes << 1,pbBuffer);
    }
    else {
      this_local._4_4_ = 0x69;
    }
  }
  else {
    this_local._4_4_ = 0x69;
  }
  return this_local._4_4_;
}

Assistant:

int CASC_CSV::GetBinary(LPBYTE pbBuffer, size_t nMaxBytes, size_t Index)
{
    // Check for index overflow and buffer overflow
    if (Index >= nColumns)
        return ERROR_INSUFFICIENT_BUFFER;
    if (Columns[Index].nLength != nMaxBytes * 2)
        return ERROR_INSUFFICIENT_BUFFER;

    // Convert the string to binary
    return ConvertStringToBinary(Columns[Index].szString, nMaxBytes * 2, pbBuffer);
}